

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_large_deflate(uchar *compr,size_t comprLen,uchar *uncompr,size_t uncomprLen,int zng_params
                       )

{
  uint uVar1;
  int iVar2;
  uint extraout_EAX;
  ulong uVar3;
  ulong extraout_RAX;
  undefined8 *extraout_RDX;
  char *pcVar4;
  char *pcStack_150;
  int iStack_148;
  undefined8 uStack_140;
  undefined4 uStack_130;
  long lStack_128;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  uchar *puStack_e8;
  code *pcStack_e0;
  int level;
  int local_cc;
  zng_deflate_param_value params [2];
  uchar *local_88;
  uint local_80;
  uchar *local_70;
  undefined4 local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  params[0].buf = &level;
  level = -1;
  params[1].buf = &local_cc;
  local_cc = -1;
  params[0].param = Z_DEFLATE_LEVEL;
  params[0].size = 4;
  params[1].param = Z_DEFLATE_STRATEGY;
  params[1].size = 4;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  pcStack_e0 = (code *)0x1039dd;
  uVar1 = zng_deflateInit(&local_88,1);
  if (uVar1 == 0) {
    local_68 = (undefined4)comprLen;
    local_80 = 40000;
    pcStack_e0 = (code *)0x103a03;
    local_88 = uncompr;
    local_70 = compr;
    uVar1 = zng_deflate(&local_88,0);
    if (uVar1 != 0) {
LAB_00103b41:
      pcVar4 = "deflate";
      goto LAB_00103b8f;
    }
    if (local_80 != 0) {
      pcVar4 = "deflate not greedy\n";
LAB_00103b7a:
      pcStack_e0 = (code *)0x103b81;
      error(pcVar4);
      uVar1 = extraout_EAX;
LAB_00103b81:
      pcVar4 = "deflateEnd";
      goto LAB_00103b8f;
    }
    if ((int)uncomprLen == 0) {
      pcStack_e0 = (code *)0x103a67;
      zng_deflateParams(&local_88,0,0);
LAB_00103a67:
      diff = (int)local_70 - (int)compr;
      pcStack_e0 = (code *)0x103a85;
      local_88 = compr;
      local_80 = diff;
      uVar1 = zng_deflate(&local_88,0);
      if (uVar1 == 0) {
        if ((int)uncomprLen == 0) {
          pcStack_e0 = (code *)0x103af9;
          zng_deflateParams(&local_88,9,1);
        }
        else {
          level = -1;
          local_cc = -1;
          pcStack_e0 = (code *)0x103aad;
          zng_deflateGetParams(&local_88,params,2);
          if (level != 0) {
            pcVar4 = "Expected compression level Z_NO_COMPRESSION, got %d\n";
            iStack_148 = level;
            goto LAB_00103ba8;
          }
          if (local_cc != 0) goto LAB_00103b51;
          level = 9;
          local_cc = 1;
          pcStack_e0 = (code *)0x103ae7;
          zng_deflateSetParams(&local_88,params,2);
        }
        local_80 = 40000;
        pcStack_e0 = (code *)0x103b0f;
        local_88 = uncompr;
        uVar1 = zng_deflate(&local_88,0);
        if (uVar1 == 0) {
          pcStack_e0 = (code *)0x103b20;
          iVar2 = zng_deflate(&local_88,4);
          if (iVar2 != 1) {
            pcVar4 = "deflate should report Z_STREAM_END\n";
            goto LAB_00103b7a;
          }
          pcStack_e0 = (code *)0x103b2f;
          uVar1 = zng_deflateEnd(&local_88);
          if (uVar1 == 0) {
            return;
          }
          goto LAB_00103b81;
        }
      }
      goto LAB_00103b41;
    }
    pcStack_e0 = (code *)0x103a2c;
    zng_deflateGetParams(&local_88,params,2);
    iStack_148 = level;
    if (level == 1) {
      if (local_cc == 0) {
        level = 0;
        pcStack_e0 = (code *)0x103a5c;
        zng_deflateSetParams(&local_88,params,2);
        goto LAB_00103a67;
      }
LAB_00103b51:
      pcVar4 = "Expected compression strategy Z_DEFAULT_STRATEGY, got %d\n";
      iStack_148 = local_cc;
      goto LAB_00103ba8;
    }
  }
  else {
    pcVar4 = "deflateInit";
LAB_00103b8f:
    pcStack_e0 = (code *)0x103b98;
    error("%s error: %d\n",pcVar4,(ulong)uVar1);
    iStack_148 = (int)pcVar4;
  }
  pcVar4 = "Expected compression level Z_BEST_SPEED, got %d\n";
LAB_00103ba8:
  pcStack_e0 = test_large_inflate;
  error(pcVar4);
  *extraout_RDX = 0x65676162726167;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_140 = 0;
  lStack_128 = 0;
  pcStack_150 = pcVar4;
  puStack_e8 = uncompr;
  pcStack_e0 = (code *)compr;
  uVar3 = zng_inflateInit(&pcStack_150);
  if ((int)uVar3 != 0) goto LAB_00103c61;
  do {
    uStack_130 = 40000;
    uVar3 = zng_inflate(&pcStack_150,0);
  } while ((int)uVar3 == 0);
  if ((int)uVar3 == 1) {
    uVar3 = zng_inflateEnd(&pcStack_150);
    if ((int)uVar3 == 0) {
      if (lStack_128 != (ulong)diff + 80000) {
        error("bad large inflate: %lu\n");
        zng_deflatePrime();
        return;
      }
      puts("large_inflate(): OK");
      return;
    }
    pcVar4 = "inflateEnd";
  }
  else {
    pcVar4 = "large inflate";
  }
  do {
    error("%s error: %d\n",pcVar4,uVar3 & 0xffffffff);
    uVar3 = extraout_RAX;
LAB_00103c61:
    pcVar4 = "inflateInit";
  } while( true );
}

Assistant:

static void test_large_deflate(unsigned char *compr, size_t comprLen, unsigned char *uncompr, size_t uncomprLen, int zng_params) {
    PREFIX3(stream) c_stream; /* compression stream */
    int err;
#ifndef ZLIB_COMPAT
    int level = -1;
    int strategy = -1;
    zng_deflate_param_value params[2];

    params[0].param = Z_DEFLATE_LEVEL;
    params[0].buf = &level;
    params[0].size = sizeof(level);

    params[1].param = Z_DEFLATE_STRATEGY;
    params[1].buf = &strategy;
    params[1].size = sizeof(strategy);
#endif

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (void *)0;

    err = PREFIX(deflateInit)(&c_stream, Z_BEST_SPEED);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_out = compr;
    c_stream.avail_out = (unsigned int)comprLen;

    /* At this point, uncompr is still mostly zeroes, so it should compress
     * very well:
     */
    c_stream.next_in = uncompr;
    c_stream.avail_in = (unsigned int)uncomprLen;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");
    if (c_stream.avail_in != 0)
        error("deflate not greedy\n");

    /* Feed in already compressed data and switch to no compression: */
    if (zng_params) {
#ifndef ZLIB_COMPAT
        zng_deflateGetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
        if (level != Z_BEST_SPEED)
            error("Expected compression level Z_BEST_SPEED, got %d\n", level);
        if (strategy != Z_DEFAULT_STRATEGY)
            error("Expected compression strategy Z_DEFAULT_STRATEGY, got %d\n", strategy);
        level = Z_NO_COMPRESSION;
        strategy = Z_DEFAULT_STRATEGY;
        zng_deflateSetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
#else
        error("test_large_deflate() called with zng_params=1 in compat mode\n");
#endif
    } else {
        PREFIX(deflateParams)(&c_stream, Z_NO_COMPRESSION, Z_DEFAULT_STRATEGY);
    }
    c_stream.next_in = compr;
    diff = (unsigned int)(c_stream.next_out - compr);
    c_stream.avail_in = diff;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    /* Switch back to compressing mode: */
    if (zng_params) {
#ifndef ZLIB_COMPAT
        level = -1;
        strategy = -1;
        zng_deflateGetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
        if (level != Z_NO_COMPRESSION)
            error("Expected compression level Z_NO_COMPRESSION, got %d\n", level);
        if (strategy != Z_DEFAULT_STRATEGY)
            error("Expected compression strategy Z_DEFAULT_STRATEGY, got %d\n", strategy);
        level = Z_BEST_COMPRESSION;
        strategy = Z_FILTERED;
        zng_deflateSetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
#else
        error("test_large_deflate() called with zng_params=1 in compat mode\n");
#endif
    } else {
        PREFIX(deflateParams)(&c_stream, Z_BEST_COMPRESSION, Z_FILTERED);
    }
    c_stream.next_in = uncompr;
    c_stream.avail_in = (unsigned int)uncomprLen;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    err = PREFIX(deflate)(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END)
        error("deflate should report Z_STREAM_END\n");
    err = PREFIX(deflateEnd)(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}